

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerHLSL::emit_glsl_op
          (CompilerHLSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t count)

{
  uint32_t uVar1;
  BaseType input_type;
  BaseType BVar2;
  SPIRType *pSVar3;
  runtime_error *prVar4;
  uint32_t uVar5;
  uint32_t op2;
  char *pcVar6;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar1 = CompilerGLSL::get_integer_width_for_glsl_instruction
                    (&this->super_CompilerGLSL,eop,args,count);
  input_type = to_signed_basetype(uVar1);
  BVar2 = to_unsigned_basetype(uVar1);
  switch(eop) {
  case 2:
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"roundEven is not supported on HLSL.","");
    ::std::runtime_error::runtime_error(prVar4,(string *)local_50);
    *(undefined ***)prVar4 = &PTR__runtime_error_00357118;
    __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  default:
    goto LAB_0021b7d0;
  case 10:
    uVar1 = *args;
    pcVar6 = "frac";
    break;
  case 0x16:
  case 0x17:
  case 0x18:
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Inverse hyperbolics are not supported on HLSL.","");
    ::std::runtime_error::runtime_error(prVar4,(string *)local_50);
    *(undefined ***)prVar4 = &PTR__runtime_error_00357118;
    __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  case 0x19:
    uVar1 = *args;
    uVar5 = args[1];
    pcVar6 = "atan2";
    goto LAB_0021b70b;
  case 0x20:
    uVar1 = *args;
    pcVar6 = "rsqrt";
    break;
  case 0x22:
    pSVar3 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar1 = pSVar3->vecsize;
    uVar5 = pSVar3->columns;
    if (uVar5 == 2 && uVar1 == 2) {
      if (this->requires_inverse_2x2 == false) {
        this->requires_inverse_2x2 = true;
        goto LAB_0021b805;
      }
    }
    else if (uVar5 == 3 && uVar1 == 3) {
      if (this->requires_inverse_3x3 == false) {
        this->requires_inverse_3x3 = true;
LAB_0021b805:
        Compiler::force_recompile((Compiler *)this);
      }
    }
    else if ((uVar5 == 4 && uVar1 == 4) && (this->requires_inverse_4x4 == false)) {
      this->requires_inverse_4x4 = true;
      goto LAB_0021b805;
    }
    uVar1 = *args;
    pcVar6 = "SPIRV_Cross_Inverse";
    break;
  case 0x2e:
  case 0x2f:
    uVar1 = *args;
    uVar5 = args[1];
    op2 = args[2];
    pcVar6 = "lerp";
    goto LAB_0021b67e;
  case 0x32:
    uVar1 = *args;
    uVar5 = args[1];
    op2 = args[2];
    pcVar6 = "mad";
LAB_0021b67e:
    CompilerGLSL::emit_trinary_func_op
              (&this->super_CompilerGLSL,result_type,id,uVar1,uVar5,op2,pcVar6);
    return;
  case 0x36:
    if (this->requires_snorm8_packing == false) {
      this->requires_snorm8_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    uVar1 = *args;
    pcVar6 = "SPIRV_Cross_packSnorm4x8";
    break;
  case 0x37:
    if (this->requires_unorm8_packing == false) {
      this->requires_unorm8_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    uVar1 = *args;
    pcVar6 = "SPIRV_Cross_packUnorm4x8";
    break;
  case 0x38:
    if (this->requires_snorm16_packing == false) {
      this->requires_snorm16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    uVar1 = *args;
    pcVar6 = "SPIRV_Cross_packSnorm2x16";
    break;
  case 0x39:
    if (this->requires_unorm16_packing == false) {
      this->requires_unorm16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    uVar1 = *args;
    pcVar6 = "SPIRV_Cross_packUnorm2x16";
    break;
  case 0x3a:
    if (this->requires_fp16_packing == false) {
      this->requires_fp16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    uVar1 = *args;
    pcVar6 = "SPIRV_Cross_packHalf2x16";
    break;
  case 0x3b:
  case 0x41:
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"packDouble2x32/unpackDouble2x32 not supported in HLSL.","");
    ::std::runtime_error::runtime_error(prVar4,(string *)local_50);
    *(undefined ***)prVar4 = &PTR__runtime_error_00357118;
    __cxa_throw(prVar4,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  case 0x3c:
    if (this->requires_snorm16_packing == false) {
      this->requires_snorm16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    uVar1 = *args;
    pcVar6 = "SPIRV_Cross_unpackSnorm2x16";
    break;
  case 0x3d:
    if (this->requires_unorm16_packing == false) {
      this->requires_unorm16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    uVar1 = *args;
    pcVar6 = "SPIRV_Cross_unpackUnorm2x16";
    break;
  case 0x3e:
    if (this->requires_fp16_packing == false) {
      this->requires_fp16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    uVar1 = *args;
    pcVar6 = "SPIRV_Cross_unpackHalf2x16";
    break;
  case 0x3f:
    if (this->requires_snorm8_packing == false) {
      this->requires_snorm8_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    uVar1 = *args;
    pcVar6 = "SPIRV_Cross_unpackSnorm4x8";
    break;
  case 0x40:
    if (this->requires_unorm8_packing == false) {
      this->requires_unorm8_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    uVar1 = *args;
    pcVar6 = "SPIRV_Cross_unpackUnorm4x8";
    break;
  case 0x45:
    pSVar3 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar3->vecsize == 1) {
      uVar1 = *args;
      pcVar6 = "sign";
      break;
    }
    eop = 0x45;
    goto LAB_0021b7d0;
  case 0x46:
    pSVar3 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + result_type);
    if (pSVar3->vecsize == 1) {
      if (this->requires_scalar_faceforward == false) {
        this->requires_scalar_faceforward = true;
        Compiler::force_recompile((Compiler *)this);
      }
      uVar1 = *args;
      uVar5 = args[1];
      op2 = args[2];
      pcVar6 = "SPIRV_Cross_FaceForward";
      goto LAB_0021b67e;
    }
    eop = 0x46;
    goto LAB_0021b7d0;
  case 0x47:
    pSVar3 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + result_type);
    if (pSVar3->vecsize == 1) {
      if (this->requires_scalar_reflect == false) {
        this->requires_scalar_reflect = true;
        Compiler::force_recompile((Compiler *)this);
      }
      uVar1 = *args;
      uVar5 = args[1];
      pcVar6 = "SPIRV_Cross_Reflect";
      goto LAB_0021b70b;
    }
    eop = 0x47;
    goto LAB_0021b7d0;
  case 0x48:
    pSVar3 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + result_type);
    if (pSVar3->vecsize == 1) {
      if (this->requires_scalar_refract == false) {
        this->requires_scalar_refract = true;
        Compiler::force_recompile((Compiler *)this);
      }
      uVar1 = *args;
      uVar5 = args[1];
      op2 = args[2];
      pcVar6 = "SPIRV_Cross_Refract";
      goto LAB_0021b67e;
    }
    eop = 0x48;
LAB_0021b7d0:
    CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,result_type,id,eop,args,count);
    return;
  case 0x49:
    pSVar3 = Compiler::expression_type((Compiler *)this,*args);
    input_type = *(BaseType *)&(pSVar3->super_IVariant).field_0xc;
    uVar1 = *args;
    pcVar6 = "firstbitlow";
    goto LAB_0021b74a;
  case 0x4a:
    uVar1 = *args;
    pcVar6 = "firstbithigh";
    goto LAB_0021b74a;
  case 0x4b:
    uVar1 = *args;
    pcVar6 = "firstbithigh";
    input_type = BVar2;
LAB_0021b74a:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,result_type,id,uVar1,pcVar6,input_type,input_type);
    return;
  case 0x4c:
    uVar1 = *args;
    pcVar6 = "EvaluateAttributeAtCentroid";
    break;
  case 0x4d:
    uVar1 = *args;
    uVar5 = args[1];
    pcVar6 = "EvaluateAttributeAtSample";
    goto LAB_0021b70b;
  case 0x4e:
    uVar1 = *args;
    uVar5 = args[1];
    pcVar6 = "EvaluateAttributeSnapped";
LAB_0021b70b:
    CompilerGLSL::emit_binary_func_op(&this->super_CompilerGLSL,result_type,id,uVar1,uVar5,pcVar6);
    return;
  }
  CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,result_type,id,uVar1,pcVar6);
  return;
}

Assistant:

void CompilerHLSL::emit_glsl_op(uint32_t result_type, uint32_t id, uint32_t eop, const uint32_t *args, uint32_t count)
{
	auto op = static_cast<GLSLstd450>(eop);

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_glsl_instruction(op, args, count);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	switch (op)
	{
	case GLSLstd450InverseSqrt:
		emit_unary_func_op(result_type, id, args[0], "rsqrt");
		break;

	case GLSLstd450Fract:
		emit_unary_func_op(result_type, id, args[0], "frac");
		break;

	case GLSLstd450RoundEven:
		SPIRV_CROSS_THROW("roundEven is not supported on HLSL.");

	case GLSLstd450Acosh:
	case GLSLstd450Asinh:
	case GLSLstd450Atanh:
		SPIRV_CROSS_THROW("Inverse hyperbolics are not supported on HLSL.");

	case GLSLstd450FMix:
	case GLSLstd450IMix:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "lerp");
		break;

	case GLSLstd450Atan2:
		emit_binary_func_op(result_type, id, args[0], args[1], "atan2");
		break;

	case GLSLstd450Fma:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "mad");
		break;

	case GLSLstd450InterpolateAtCentroid:
		emit_unary_func_op(result_type, id, args[0], "EvaluateAttributeAtCentroid");
		break;
	case GLSLstd450InterpolateAtSample:
		emit_binary_func_op(result_type, id, args[0], args[1], "EvaluateAttributeAtSample");
		break;
	case GLSLstd450InterpolateAtOffset:
		emit_binary_func_op(result_type, id, args[0], args[1], "EvaluateAttributeSnapped");
		break;

	case GLSLstd450PackHalf2x16:
		if (!requires_fp16_packing)
		{
			requires_fp16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "SPIRV_Cross_packHalf2x16");
		break;

	case GLSLstd450UnpackHalf2x16:
		if (!requires_fp16_packing)
		{
			requires_fp16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "SPIRV_Cross_unpackHalf2x16");
		break;

	case GLSLstd450PackSnorm4x8:
		if (!requires_snorm8_packing)
		{
			requires_snorm8_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "SPIRV_Cross_packSnorm4x8");
		break;

	case GLSLstd450UnpackSnorm4x8:
		if (!requires_snorm8_packing)
		{
			requires_snorm8_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "SPIRV_Cross_unpackSnorm4x8");
		break;

	case GLSLstd450PackUnorm4x8:
		if (!requires_unorm8_packing)
		{
			requires_unorm8_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "SPIRV_Cross_packUnorm4x8");
		break;

	case GLSLstd450UnpackUnorm4x8:
		if (!requires_unorm8_packing)
		{
			requires_unorm8_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "SPIRV_Cross_unpackUnorm4x8");
		break;

	case GLSLstd450PackSnorm2x16:
		if (!requires_snorm16_packing)
		{
			requires_snorm16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "SPIRV_Cross_packSnorm2x16");
		break;

	case GLSLstd450UnpackSnorm2x16:
		if (!requires_snorm16_packing)
		{
			requires_snorm16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "SPIRV_Cross_unpackSnorm2x16");
		break;

	case GLSLstd450PackUnorm2x16:
		if (!requires_unorm16_packing)
		{
			requires_unorm16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "SPIRV_Cross_packUnorm2x16");
		break;

	case GLSLstd450UnpackUnorm2x16:
		if (!requires_unorm16_packing)
		{
			requires_unorm16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "SPIRV_Cross_unpackUnorm2x16");
		break;

	case GLSLstd450PackDouble2x32:
	case GLSLstd450UnpackDouble2x32:
		SPIRV_CROSS_THROW("packDouble2x32/unpackDouble2x32 not supported in HLSL.");

	case GLSLstd450FindILsb:
	{
		auto basetype = expression_type(args[0]).basetype;
		emit_unary_func_op_cast(result_type, id, args[0], "firstbitlow", basetype, basetype);
		break;
	}

	case GLSLstd450FindSMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "firstbithigh", int_type, int_type);
		break;

	case GLSLstd450FindUMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "firstbithigh", uint_type, uint_type);
		break;

	case GLSLstd450MatrixInverse:
	{
		auto &type = get<SPIRType>(result_type);
		if (type.vecsize == 2 && type.columns == 2)
		{
			if (!requires_inverse_2x2)
			{
				requires_inverse_2x2 = true;
				force_recompile();
			}
		}
		else if (type.vecsize == 3 && type.columns == 3)
		{
			if (!requires_inverse_3x3)
			{
				requires_inverse_3x3 = true;
				force_recompile();
			}
		}
		else if (type.vecsize == 4 && type.columns == 4)
		{
			if (!requires_inverse_4x4)
			{
				requires_inverse_4x4 = true;
				force_recompile();
			}
		}
		emit_unary_func_op(result_type, id, args[0], "SPIRV_Cross_Inverse");
		break;
	}

	case GLSLstd450Normalize:
		// HLSL does not support scalar versions here.
		if (expression_type(args[0]).vecsize == 1)
		{
			// Returns -1 or 1 for valid input, sign() does the job.
			emit_unary_func_op(result_type, id, args[0], "sign");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Reflect:
		if (get<SPIRType>(result_type).vecsize == 1)
		{
			if (!requires_scalar_reflect)
			{
				requires_scalar_reflect = true;
				force_recompile();
			}
			emit_binary_func_op(result_type, id, args[0], args[1], "SPIRV_Cross_Reflect");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Refract:
		if (get<SPIRType>(result_type).vecsize == 1)
		{
			if (!requires_scalar_refract)
			{
				requires_scalar_refract = true;
				force_recompile();
			}
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "SPIRV_Cross_Refract");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450FaceForward:
		if (get<SPIRType>(result_type).vecsize == 1)
		{
			if (!requires_scalar_faceforward)
			{
				requires_scalar_faceforward = true;
				force_recompile();
			}
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "SPIRV_Cross_FaceForward");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	default:
		CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}
}